

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp_client.cpp
# Opt level: O0

bool loop_established(bgp_client_peer *peer)

{
  int __fd;
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ssize_t sVar5;
  int *piVar6;
  undefined1 local_1083 [8];
  bgp_header header;
  bgp_notification *bgpntp;
  uint8_t capability_length;
  uint uStack_1060;
  uint8_t capability_type;
  int option_length;
  int option_type;
  int read_length;
  bgp_header **local_1050;
  bgp_open *bgpopp;
  ushort local_103e;
  int local_103c;
  int iStack_1038;
  uint16_t error;
  int remain_byte;
  int append_len;
  int entire_length;
  bgp_header *bgphp;
  uchar buff [4096];
  int local_1c;
  int len;
  bgp_client_peer *peer_local;
  
  memset(&bgphp,0,0x1000);
  sVar5 = recv(peer->sock,&bgphp,0x13,0);
  local_1c = (int)sVar5;
  if (0 < local_1c) {
    _append_len = &bgphp;
    uVar2 = ntohs(buff._8_2_);
    remain_byte = (int)uVar2;
    log<int>(TRACE,"Receiving %d bytes",&remain_byte);
    local_103e = 0;
    while (local_1c < remain_byte) {
      local_103c = remain_byte - local_1c;
      log<int>(TRACE,"%d bytes remain",&local_103c);
      __fd = peer->sock;
      bgpopp._4_4_ = 1000;
      piVar6 = std::min<int>(&local_103c,(int *)((long)&bgpopp + 4));
      sVar5 = recv(__fd,buff + (long)local_1c + -8,(long)*piVar6,0);
      iStack_1038 = (int)sVar5;
      if (iStack_1038 < 1) {
        local_103e = local_103e + 1;
        if (10000 < local_103e) {
          log<>(ERROR,"Failed to receive packet");
          abort();
        }
      }
      else {
        log<int>(TRACE,"New %d bytes received",&stack0xffffffffffffefc8);
        local_1c = iStack_1038 + local_1c;
      }
    }
    switch(*(undefined1 *)((long)_append_len + 0x12)) {
    case 1:
      log<>(INFO,"Open Received");
      local_1050 = &bgphp;
      log<unsigned_char>(INFO,"Version: %d",buff + 0xb);
      read_length._2_2_ = ntohs(*(uint16_t *)((long)local_1050 + 0x14));
      log<unsigned_short>(INFO,"My AS: %d",(unsigned_short *)((long)&read_length + 2));
      read_length._0_2_ = ntohs(*(uint16_t *)((long)local_1050 + 0x16));
      log<unsigned_short>(INFO,"Hold Time: %d",(unsigned_short *)&read_length);
      option_type = ntohl(*(uint32_t *)(local_1050 + 3));
      log<unsigned_int>(INFO,"BGP Id: %d",(uint *)&option_type);
      log<unsigned_char>(INFO,"Opt Length: %d",(uchar *)((long)local_1050 + 0x1c));
      uVar2 = ntohs(*(uint16_t *)((long)local_1050 + 0x14));
      if ((uint)uVar2 != peer->remote_as) {
        send_notification(&peer->super_bgp_peer,'\x02',2);
        return false;
      }
      option_length = 0x1d;
      while (option_length < (int)(*(byte *)((long)local_1050 + 0x1c) + 0x1d)) {
        uStack_1060 = (uint)buff[(long)option_length + -8];
        bgpntp._4_4_ = (uint)buff[(long)(option_length + 1) + -8];
        if (uStack_1060 == 2) {
          bgpntp._3_1_ = buff[(long)(option_length + 2) + -8];
          bgpntp._2_1_ = buff[(long)(option_length + 3) + -8];
          option_length = option_length + 4 + (uint)bgpntp._2_1_;
          log<unsigned_char>(INFO,"Capability type : %d",(uchar *)((long)&bgpntp + 3));
          if ((bgpntp._3_1_ != '\x01') && (bgpntp._3_1_ == 'A')) {
            (peer->super_bgp_peer).is_4_octet_as_supported = true;
            log<>(INFO,"Supported 4-octet AS number!");
          }
        }
        else {
          option_length = option_length + 2;
          log<int>(INFO,"Option type : %d",(int *)&stack0xffffffffffffefa0);
        }
      }
      uVar3 = ntohl(*(uint32_t *)(local_1050 + 3));
      (peer->super_bgp_peer).bgp_id = uVar3;
      bVar1 = send_open(&peer->super_bgp_peer);
      if (!bVar1) {
        log<>(ERROR,"Failed to send packet");
        return false;
      }
      break;
    case 2:
      log<>(INFO,"Update received");
      bgp_update(&peer->super_bgp_peer,(uchar *)&bgphp,remain_byte);
      break;
    case 3:
      log<>(NOTICE,"Notification received");
      header._11_8_ = &bgphp;
      log<unsigned_char>(NOTICE,"Error: %d",buff + 0xb);
      log<unsigned_char>(NOTICE,"Sub: %d",(uchar *)(header._11_8_ + 0x14));
      return false;
    case 4:
      if ((peer->super_bgp_peer).state == '\x04') {
        ((peer->super_bgp_peer).adj_ribs_in)->is_prefix = true;
        ((peer->super_bgp_peer).adj_ribs_in)->prefix = 0;
        ((peer->super_bgp_peer).adj_ribs_in)->prefix_len = '\0';
        ((peer->super_bgp_peer).adj_ribs_in)->data = (adj_ribs_in_data *)0x0;
        ((peer->super_bgp_peer).adj_ribs_in)->parent = (node<adj_ribs_in_data> *)0x0;
        ((peer->super_bgp_peer).adj_ribs_in)->node_0 = (node<adj_ribs_in_data> *)0x0;
        ((peer->super_bgp_peer).adj_ribs_in)->node_1 = (node<adj_ribs_in_data> *)0x0;
        (peer->super_bgp_peer).state = '\x05';
      }
      log<>(INFO,"Keepalive Received");
      memset(local_1083,0xff,0x10);
      header.maker._8_2_ = htons(0x13);
      header.maker[10] = '\x04';
      uVar4 = (**(peer->super_bgp_peer)._vptr_bgp_peer)(peer,local_1083,(long)local_1c);
      if ((uVar4 & 1) == 0) {
        log<>(ERROR,"Failed to send packet");
        return false;
      }
      break;
    default:
      log<unsigned_char>(ERROR,"Unknown type received %d",(uchar *)((long)_append_len + 0x12));
    }
  }
  return true;
}

Assistant:

bool loop_established(bgp_client_peer* peer){
    int len;
    unsigned char buff[4096];
    //printf("\e[m");
    memset(buff, 0x00, 4096);
    len = recv(peer->sock, &buff, 19, 0);
    if(len <= 0){
        return true;
    }
    auto* bgphp = reinterpret_cast<bgp_header*>(buff);

    // hex_dump(buff, 29); // dump header
    int entire_length = ntohs(bgphp->length);
    log(log_level::TRACE, "Receiving %d bytes", entire_length);

    int append_len, remain_byte;
    uint16_t error = 0;
    while(len < entire_length){
        remain_byte = entire_length - len;
        log(log_level::TRACE, "%d bytes remain", remain_byte);
        append_len = recv(peer->sock, &buff[len], std::min(remain_byte, 1000), 0);
        if(append_len <= 0){
            if(++error > 10000){
                log(log_level::ERROR, "Failed to receive packet");
                abort();
            }
            continue;
        }
        log(log_level::TRACE, "New %d bytes received", append_len);
        len += append_len;
    }

    switch(bgphp->type){
        case OPEN:{
            log(log_level::INFO, "Open Received");
            auto* bgpopp = reinterpret_cast<bgp_open*>(buff);
            log(log_level::INFO, "Version: %d", bgpopp->version);
            log(log_level::INFO, "My AS: %d", ntohs(bgpopp->my_as));
            log(log_level::INFO, "Hold Time: %d", ntohs(bgpopp->hold_time));
            log(log_level::INFO, "BGP Id: %d", ntohl(bgpopp->bgp_id));
            log(log_level::INFO, "Opt Length: %d", bgpopp->opt_length);

            if(ntohs(bgpopp->my_as) != peer->remote_as){
                send_notification(peer, bgp_error_code::OPEN_MESSAGE_ERROR, bgp_error_sub_code_open::BAD_PEER_AS);
                return false;
            }

            int read_length = 29;
            while(read_length < 29 + bgpopp->opt_length){
                int option_type = buff[read_length];
                read_length++;
                int option_length = buff[read_length];
                read_length++;
                switch(option_type){
                    case bgp_open_optional_parameter_type::CAPABILITIES:{
                        uint8_t capability_type = buff[read_length];
                        read_length++;
                        uint8_t capability_length = buff[read_length];
                        read_length++;
                        read_length += capability_length;
                        log(log_level::INFO, "Capability type : %d", capability_type);
                        switch(capability_type){
                            case bgp_capability_code::MULTIPROTOCOL_EXTENSION_FOR_BGP4:
                                break;
                            case bgp_capability_code::SUPPORT_FOR_4_OCTET_AS_NUMBER_CAPABILITY:
                                peer->is_4_octet_as_supported = true;
                                log(log_level::INFO, "Supported 4-octet AS number!");
                                break;
                        }
                    }
                        break;
                    default:
                        log(log_level::INFO, "Option type : %d", option_type);
                        break;
                }
            }
            peer->bgp_id = ntohl(bgpopp->bgp_id);

            if(!send_open(peer)){
                log(log_level::ERROR, "Failed to send packet");
                return false;
            }
        }
            break;
        case UPDATE:{
            log(log_level::INFO, "Update received");
            bgp_update(peer, buff, entire_length);
        }
            break;
        case NOTIFICATION:{
            log(log_level::NOTICE, "Notification received");
            auto* bgpntp = reinterpret_cast<bgp_notification*>(buff);
            log(log_level::NOTICE, "Error: %d", bgpntp->error);
            log(log_level::NOTICE, "Sub: %d", bgpntp->error_sub);
            return false;
        }
        case KEEPALIVE:{
            if(peer->state == OPEN_CONFIRM){
                peer->adj_ribs_in->is_prefix = true;
                peer->adj_ribs_in->prefix = 0;
                peer->adj_ribs_in->prefix_len = 0;
                peer->adj_ribs_in->data = nullptr;
                peer->adj_ribs_in->parent = nullptr;
                peer->adj_ribs_in->node_0 = nullptr;
                peer->adj_ribs_in->node_1 = nullptr;
                peer->state = ESTABLISHED;
            }
            log(log_level::INFO, "Keepalive Received");
            bgp_header header;
            memset(header.maker, 0xff, 16);
            header.length = htons(19);
            header.type = KEEPALIVE;
            if(!peer->send(&header, len)){
                log(log_level::ERROR, "Failed to send packet");
                return false;
            }
        }
            break;
        default:
            log(log_level::ERROR, "Unknown type received %d", bgphp->type);
            break;
    }
    return true;
}